

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::TrustStoreInMemoryTest_DistrustBySPKIOverridesTrust_Test::TestBody
          (TrustStoreInMemoryTest_DistrustBySPKIOverridesTrust_Test *this)

{
  element_type *peVar1;
  shared_ptr<const_bssl::ParsedCertificate> *psVar2;
  char *message;
  AssertionResult gtest_ar;
  string local_108;
  string local_e8;
  CertificateTrust trust;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_c0;
  CertificateTrust local_b0;
  string local_a8;
  TrustStoreInMemory in_memory;
  
  TrustStoreInMemory::TrustStoreInMemory(&in_memory);
  psVar2 = &(this->super_TrustStoreInMemoryTest).newroot_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,
             &psVar2->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  TrustStoreInMemory::AddTrustAnchor
            (&in_memory,(shared_ptr<const_bssl::ParsedCertificate> *)&local_c0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  peVar1 = (psVar2->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_e8._M_string_length = (size_type)(peVar1->tbs_).spki_tlv.data_.data_;
  local_e8._M_dataplus._M_p = (pointer)(peVar1->tbs_).spki_tlv.data_.size_;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_a8,(basic_string_view<char,_std::char_traits<char>_> *)&local_e8,
             (allocator<char> *)&local_108);
  TrustStoreInMemory::AddDistrustedCertificateBySPKI(&in_memory,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  trust = TrustStoreInMemory::GetTrust
                    (&in_memory,
                     (psVar2->
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  local_b0.type = DISTRUSTED;
  local_b0.enforce_anchor_expiry = false;
  local_b0.enforce_anchor_constraints = false;
  local_b0.require_anchor_basic_constraints = false;
  local_b0.require_leaf_selfsigned = false;
  CertificateTrust::ToDebugString_abi_cxx11_(&local_e8,&local_b0);
  CertificateTrust::ToDebugString_abi_cxx11_(&local_108,&trust);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"CertificateTrust::ForDistrusted().ToDebugString()",
             "trust.ToDebugString()",&local_e8,&local_108);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x6c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  TrustStoreInMemory::~TrustStoreInMemory(&in_memory);
  return;
}

Assistant:

TEST_F(TrustStoreInMemoryTest, DistrustBySPKIOverridesTrust) {
  TrustStoreInMemory in_memory;
  in_memory.AddTrustAnchor(newroot_);
  in_memory.AddDistrustedCertificateBySPKI(
      std::string(BytesAsStringView(newroot_->tbs().spki_tlv)));

  // newroot_ is distrusted.
  CertificateTrust trust = in_memory.GetTrust(newroot_.get());
  EXPECT_EQ(CertificateTrust::ForDistrusted().ToDebugString(),
            trust.ToDebugString());
}